

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

DdNode * cuddRemapUnderApprox(DdManager *dd,DdNode *f,int numVars,int threshold,double quality)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  ApproxInfo *info_00;
  int result;
  DdNode *subset;
  ApproxInfo *info;
  double quality_local;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == (DdNode *)0x0) {
    fprintf((FILE *)dd->err,"Cannot subset, nil object\n");
    dd->errorCode = CUDD_INVALID_ARG;
    dd_local = (DdManager *)0x0;
  }
  else {
    dd_local = (DdManager *)f;
    if (*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff) {
      info_00 = gatherInfo(dd,f,numVars,1);
      if (info_00 == (ApproxInfo *)0x0) {
        fprintf((FILE *)dd->err,"Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        dd_local = (DdManager *)0x0;
      }
      else {
        iVar2 = RAmarkNodes(dd,f,info_00,threshold,quality);
        if (iVar2 == 0) {
          fprintf((FILE *)dd->err,"Out-of-memory; Cannot subset\n");
          if (info_00->page != (NodeData *)0x0) {
            free(info_00->page);
            info_00->page = (NodeData *)0x0;
          }
          st__free_table(info_00->table);
          if (info_00 != (ApproxInfo *)0x0) {
            free(info_00);
          }
          dd->errorCode = CUDD_MEMORY_OUT;
          dd_local = (DdManager *)0x0;
        }
        else {
          dd_local = (DdManager *)RAbuildSubset(dd,f,info_00);
          if ((dd_local != (DdManager *)0x0) &&
             (iVar2 = info_00->size, iVar3 = Cudd_DagSize((DdNode *)dd_local), iVar2 < iVar3)) {
            __stream = (FILE *)dd->err;
            uVar1 = info_00->size;
            uVar4 = Cudd_DagSize((DdNode *)dd_local);
            fprintf(__stream,"Wrong prediction: %d versus actual %d\n",(ulong)uVar1,(ulong)uVar4);
          }
          if (info_00->page != (NodeData *)0x0) {
            free(info_00->page);
            info_00->page = (NodeData *)0x0;
          }
          st__free_table(info_00->table);
          if (info_00 != (ApproxInfo *)0x0) {
            free(info_00);
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddRemapUnderApprox(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold under which approximation stops */,
  double  quality /* minimum improvement for accepted changes */)
{
    ApproxInfo *info;
    DdNode *subset;
    int result;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    /* Create table where node data are accessible via a hash table. */
    info = gatherInfo(dd, f, numVars, TRUE);
    if (info == NULL) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Mark nodes that should be replaced by zero. */
    result = RAmarkNodes(dd, f, info, threshold, quality);
    if (result == 0) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        ABC_FREE(info->page);
        st__free_table(info->table);
        ABC_FREE(info);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Build the result. */
    subset = RAbuildSubset(dd, f, info);
#if 1
    if (subset && info->size < Cudd_DagSize(subset))
        (void) fprintf(dd->err, "Wrong prediction: %d versus actual %d\n",
                       info->size, Cudd_DagSize(subset));
#endif
    ABC_FREE(info->page);
    st__free_table(info->table);
    ABC_FREE(info);

#ifdef DD_DEBUG
    if (subset != NULL) {
        cuddRef(subset);
#if 0
        (void) Cudd_DebugCheck(dd);
        (void) Cudd_CheckKeys(dd);
#endif
        if (!Cudd_bddLeq(dd, subset, f)) {
            (void) fprintf(dd->err, "Wrong subset\n");
        }
        cuddDeref(subset);
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }
#endif
    return(subset);

}